

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

decNumber *
decQuantizeOp(decNumber *res,decNumber *lhs,decNumber *rhs,decContext *set,uint8_t quant,
             uint32_t *status)

{
  undefined4 uVar1;
  int32_t iVar2;
  undefined1 local_70 [8];
  decContext workset;
  int32_t adjust;
  int32_t etiny;
  int32_t residue;
  int32_t reqexp;
  int32_t reqdigits;
  decNumber *inrhs;
  uint32_t *status_local;
  decContext *pdStack_28;
  uint8_t quant_local;
  decContext *set_local;
  decNumber *rhs_local;
  decNumber *lhs_local;
  decNumber *res_local;
  
  residue = set->digits;
  adjust = 0;
  workset._24_4_ = set->emin - (residue + -1);
  _reqexp = rhs;
  inrhs = (decNumber *)status;
  status_local._7_1_ = quant;
  pdStack_28 = set;
  set_local = (decContext *)rhs;
  rhs_local = lhs;
  lhs_local = res;
  if (((lhs->bits | rhs->bits) & 0x70) == 0) {
    if (quant == '\0') {
      etiny = decGetInt(rhs);
    }
    else {
      etiny = rhs->exponent;
    }
    if ((((etiny == -0x80000000) || (etiny == -0x7ffffffd)) || (etiny == -0x7ffffffe)) ||
       ((etiny < (int)workset._24_4_ || (pdStack_28->emax < etiny)))) {
      inrhs->digits = inrhs->digits | 0x80;
    }
    else {
      if (((rhs_local->lsu[0] == '\0') && (rhs_local->digits == 1)) &&
         ((rhs_local->bits & 0x70) == 0)) {
        uprv_decNumberCopy_63(lhs_local,rhs_local);
        lhs_local->exponent = etiny;
      }
      else {
        workset.status = etiny - rhs_local->exponent;
        if (residue < (int)(rhs_local->digits - workset.status)) {
          inrhs->digits = inrhs->digits | 0x80;
          return lhs_local;
        }
        if ((int)workset.status < 1) {
          uprv_decNumberCopy_63(lhs_local,rhs_local);
          if ((int)workset.status < 0) {
            iVar2 = decShiftToMost(lhs_local->lsu,lhs_local->digits,-workset.status);
            lhs_local->digits = iVar2;
            lhs_local->exponent = workset.status + lhs_local->exponent;
          }
        }
        else {
          uVar1 = pdStack_28->emax;
          workset.digits = pdStack_28->emin;
          workset.emax = pdStack_28->round;
          workset.emin = pdStack_28->traps;
          workset.round = pdStack_28->status;
          workset.traps = *(uint32_t *)&pdStack_28->clamp;
          local_70._4_4_ = uVar1;
          local_70._0_4_ = rhs_local->digits - workset.status;
          decCopyFit(lhs_local,rhs_local,(decContext *)local_70,&adjust,(uint32_t *)inrhs);
          decApplyRound(lhs_local,(decContext *)local_70,adjust,(uint32_t *)inrhs);
          adjust = 0;
          if (etiny < lhs_local->exponent) {
            if (lhs_local->digits == residue) {
              inrhs->digits = inrhs->digits & 0xfffff7df;
              inrhs->digits = inrhs->digits | 0x80;
              return lhs_local;
            }
            iVar2 = decShiftToMost(lhs_local->lsu,lhs_local->digits,1);
            lhs_local->digits = iVar2;
            lhs_local->exponent = lhs_local->exponent + -1;
          }
        }
      }
      if ((pdStack_28->emax - lhs_local->digits) + 1 < lhs_local->exponent) {
        inrhs->digits = inrhs->digits | 0x80;
      }
      else {
        decFinalize(lhs_local,pdStack_28,&adjust,(uint32_t *)inrhs);
        inrhs->digits = inrhs->digits & 0xffffdfff;
      }
    }
  }
  else if (((lhs->bits | rhs->bits) & 0x30) == 0) {
    if (((lhs->bits ^ rhs->bits) & 0x40) == 0) {
      uprv_decNumberCopy_63(res,lhs);
    }
    else {
      *status = *status | 0x80;
    }
  }
  else {
    decNaNs(res,lhs,rhs,set,status);
  }
  return lhs_local;
}

Assistant:

static decNumber * decQuantizeOp(decNumber *res, const decNumber *lhs,
                                 const decNumber *rhs, decContext *set,
                                 Flag quant, uInt *status) {
  #if DECSUBSET
  decNumber *alloclhs=NULL;        /* non-NULL if rounded lhs allocated  */
  decNumber *allocrhs=NULL;        /* .., rhs  */
  #endif
  const decNumber *inrhs=rhs;      /* save original rhs  */
  Int   reqdigits=set->digits;     /* requested DIGITS  */
  Int   reqexp;                    /* requested exponent [-scale]  */
  Int   residue=0;                 /* rounding residue  */
  Int   etiny=set->emin-(reqdigits-1);

  #if DECCHECK
  if (decCheckOperands(res, lhs, rhs, set)) return res;
  #endif

  do {                             /* protect allocated storage  */
    #if DECSUBSET
    if (!set->extended) {
      /* reduce operands and set lostDigits status, as needed  */
      if (lhs->digits>reqdigits) {
        alloclhs=decRoundOperand(lhs, set, status);
        if (alloclhs==NULL) break;
        lhs=alloclhs;
        }
      if (rhs->digits>reqdigits) { /* [this only checks lostDigits]  */
        allocrhs=decRoundOperand(rhs, set, status);
        if (allocrhs==NULL) break;
        rhs=allocrhs;
        }
      }
    #endif
    /* [following code does not require input rounding]  */

    /* Handle special values  */
    if (SPECIALARGS) {
      /* NaNs get usual processing  */
      if (SPECIALARGS & (DECSNAN | DECNAN))
        decNaNs(res, lhs, rhs, set, status);
      /* one infinity but not both is bad  */
      else if ((lhs->bits ^ rhs->bits) & DECINF)
        *status|=DEC_Invalid_operation;
      /* both infinity: return lhs  */
      else uprv_decNumberCopy(res, lhs);          /* [nop if in place]  */
      break;
      }

    /* set requested exponent  */
    if (quant) reqexp=inrhs->exponent;  /* quantize -- match exponents  */
     else {                             /* rescale -- use value of rhs  */
      /* Original rhs must be an integer that fits and is in range,  */
      /* which could be from -1999999997 to +999999999, thanks to  */
      /* subnormals  */
      reqexp=decGetInt(inrhs);               /* [cannot fail]  */
      }

    #if DECSUBSET
    if (!set->extended) etiny=set->emin;     /* no subnormals  */
    #endif

    if (reqexp==BADINT                       /* bad (rescale only) or ..  */
     || reqexp==BIGODD || reqexp==BIGEVEN    /* very big (ditto) or ..  */
     || (reqexp<etiny)                       /* < lowest  */
     || (reqexp>set->emax)) {                /* > emax  */
      *status|=DEC_Invalid_operation;
      break;}

    /* the RHS has been processed, so it can be overwritten now if necessary  */
    if (ISZERO(lhs)) {                       /* zero coefficient unchanged  */
      uprv_decNumberCopy(res, lhs);               /* [nop if in place]  */
      res->exponent=reqexp;                  /* .. just set exponent  */
      #if DECSUBSET
      if (!set->extended) res->bits=0;       /* subset specification; no -0  */
      #endif
      }
     else {                                  /* non-zero lhs  */
      Int adjust=reqexp-lhs->exponent;       /* digit adjustment needed  */
      /* if adjusted coefficient will definitely not fit, give up now  */
      if ((lhs->digits-adjust)>reqdigits) {
        *status|=DEC_Invalid_operation;
        break;
        }

      if (adjust>0) {                        /* increasing exponent  */
        /* this will decrease the length of the coefficient by adjust  */
        /* digits, and must round as it does so  */
        decContext workset;                  /* work  */
        workset=*set;                        /* clone rounding, etc.  */
        workset.digits=lhs->digits-adjust;   /* set requested length  */
        /* [note that the latter can be <1, here]  */
        decCopyFit(res, lhs, &workset, &residue, status); /* fit to result  */
        decApplyRound(res, &workset, residue, status);    /* .. and round  */
        residue=0;                                        /* [used]  */
        /* If just rounded a 999s case, exponent will be off by one;  */
        /* adjust back (after checking space), if so.  */
        if (res->exponent>reqexp) {
          /* re-check needed, e.g., for quantize(0.9999, 0.001) under  */
          /* set->digits==3  */
          if (res->digits==reqdigits) {      /* cannot shift by 1  */
            *status&=~(DEC_Inexact | DEC_Rounded); /* [clean these]  */
            *status|=DEC_Invalid_operation;
            break;
            }
          res->digits=decShiftToMost(res->lsu, res->digits, 1); /* shift  */
          res->exponent--;                   /* (re)adjust the exponent.  */
          }
        #if DECSUBSET
        if (ISZERO(res) && !set->extended) res->bits=0; /* subset; no -0  */
        #endif
        } /* increase  */
       else /* adjust<=0 */ {                /* decreasing or = exponent  */
        /* this will increase the length of the coefficient by -adjust  */
        /* digits, by adding zero or more trailing zeros; this is  */
        /* already checked for fit, above  */
        uprv_decNumberCopy(res, lhs);             /* [it will fit]  */
        /* if padding needed (adjust<0), add it now...  */
        if (adjust<0) {
          res->digits=decShiftToMost(res->lsu, res->digits, -adjust);
          res->exponent+=adjust;             /* adjust the exponent  */
          }
        } /* decrease  */
      } /* non-zero  */

    /* Check for overflow [do not use Finalize in this case, as an  */
    /* overflow here is a "don't fit" situation]  */
    if (res->exponent>set->emax-res->digits+1) {  /* too big  */
      *status|=DEC_Invalid_operation;
      break;
      }
     else {
      decFinalize(res, set, &residue, status);    /* set subnormal flags  */
      *status&=~DEC_Underflow;          /* suppress Underflow [as per 754]  */
      }
    } while(0);                         /* end protected  */

  #if DECSUBSET
  if (allocrhs!=NULL) free(allocrhs);   /* drop any storage used  */
  if (alloclhs!=NULL) free(alloclhs);   /* ..  */
  #endif
  return res;
  }